

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::ArrayWithPreallocation<FoundDelimiter,_4UL>::reserve
          (ArrayWithPreallocation<FoundDelimiter,_4UL> *this,size_t minSize)

{
  unsigned_long uVar1;
  FoundDelimiter *pFVar2;
  FoundDelimiter *pFVar3;
  FoundDelimiter *pFVar4;
  ulong local_28;
  size_t i;
  FoundDelimiter *newObjects;
  size_t minSize_local;
  ArrayWithPreallocation<FoundDelimiter,_4UL> *this_local;
  
  if (this->numAllocated < minSize) {
    uVar1 = getAlignedSize<16,unsigned_long>(minSize);
    if (4 < uVar1) {
      pFVar2 = (FoundDelimiter *)operator_new__(uVar1 << 5);
      for (local_28 = 0; local_28 < this->numActive; local_28 = local_28 + 1) {
        pFVar3 = pFVar2 + local_28;
        pFVar4 = this->items + local_28;
        (pFVar3->range).outerStart = (pFVar4->range).outerStart;
        (pFVar3->range).outerEnd = (pFVar4->range).outerEnd;
        (pFVar3->range).delimiterLength = (pFVar4->range).delimiterLength;
        pFVar3->type = pFVar4->type;
      }
      freeIfHeapAllocated(this);
      this->items = pFVar2;
    }
    this->numAllocated = uVar1;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }